

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O3

bool match(string *s,string *longarg,string *shortarg)

{
  pointer pcVar1;
  undefined1 *puVar2;
  int iVar3;
  undefined1 *puVar4;
  bool bVar5;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  puVar4 = local_50;
  if ((local_48 != longarg->_M_string_length) ||
     ((bVar5 = true, local_48 != 0 &&
      (iVar3 = bcmp(local_50,(longarg->_M_dataplus)._M_p,local_48), iVar3 != 0)))) {
    pcVar1 = (s->_M_dataplus)._M_p;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length);
    puVar2 = local_70;
    if (local_68 == shortarg->_M_string_length) {
      if (local_68 == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_70,(shortarg->_M_dataplus)._M_p,local_68);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    puVar4 = local_50;
    if (puVar2 != local_60) {
      operator_delete(puVar2);
      puVar4 = local_50;
    }
  }
  if (puVar4 != local_40) {
    operator_delete(puVar4);
  }
  return bVar5;
}

Assistant:

inline bool match(const std::string& s, const std::string& longarg, const std::string& shortarg)
{ return std::string(s) == longarg || std::string(s) == shortarg; }